

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O3

void __thiscall Assimp::ASE::Parser::LogError(Parser *this,char *szWarn)

{
  runtime_error *this_00;
  size_t sVar1;
  char szTemp [1024];
  undefined1 *local_448 [2];
  undefined1 local_438 [16];
  char local_428 [1032];
  
  if (szWarn == (char *)0x0) {
    __assert_fail("__null != szWarn",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/ASE/ASEParser.cpp"
                  ,0xaf,"void Assimp::ASE::Parser::LogError(const char *)");
  }
  snprintf(local_428,0x400,"Line %u: %s",(ulong)this->iLineNumber,szWarn);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_448[0] = local_438;
  sVar1 = strlen(local_428);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_448,local_428,local_428 + sVar1);
  std::runtime_error::runtime_error(this_00,(string *)local_448);
  *(undefined ***)this_00 = &PTR__runtime_error_007fc4b8;
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

AI_WONT_RETURN void Parser::LogError(const char* szWarn)
{
    ai_assert(NULL != szWarn);

    char szTemp[1024];
#if _MSC_VER >= 1400
    sprintf_s(szTemp,"Line %u: %s",iLineNumber,szWarn);
#else
    ai_snprintf(szTemp,1024,"Line %u: %s",iLineNumber,szWarn);
#endif

    // throw an exception
    throw DeadlyImportError(szTemp);
}